

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

ExecutionResult __thiscall nigel::Lexer::postLexer(Lexer *this,CodeBase *base)

{
  u8 uVar1;
  size_t sVar2;
  bool bVar3;
  __shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var4;
  element_type *peVar5;
  element_type *peVar6;
  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *p_Var7;
  element_type *peVar8;
  ulong uVar9;
  long lVar10;
  element_type *peVar11;
  element_type *peVar12;
  bool local_ae9;
  bool local_ae5;
  const_iterator local_ac0;
  reference local_ab8;
  _List_iterator<std::shared_ptr<nigel::Token>_> *remove;
  iterator __end1;
  iterator __begin1;
  list<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
  *__range1;
  shared_ptr<nigel::Token> local_a90;
  undefined4 local_a7c;
  shared_ptr<nigel::Token> local_a78;
  undefined4 local_a64;
  shared_ptr<nigel::Token> local_a60;
  undefined4 local_a4c;
  shared_ptr<nigel::Token> local_a48;
  undefined4 local_a34;
  shared_ptr<nigel::Token> local_a30;
  undefined4 local_a1c;
  shared_ptr<nigel::Token> local_a18;
  undefined4 local_a04;
  shared_ptr<nigel::Token> local_a00;
  undefined4 local_9ec;
  shared_ptr<nigel::Token> local_9e8;
  undefined4 local_9d4;
  shared_ptr<nigel::Token> local_9d0;
  undefined4 local_9bc;
  shared_ptr<nigel::Token> local_9b8;
  undefined4 local_9a4;
  shared_ptr<nigel::Token> local_9a0;
  undefined4 local_98c;
  shared_ptr<nigel::Token> local_988;
  undefined4 local_974;
  shared_ptr<nigel::Token> local_970;
  undefined4 local_95c;
  shared_ptr<nigel::Token> local_958;
  undefined4 local_944;
  shared_ptr<nigel::Token> local_940;
  undefined4 local_92c;
  shared_ptr<nigel::Token> local_928;
  undefined4 local_914;
  shared_ptr<nigel::Token> local_910;
  undefined1 local_900 [27];
  u8 t;
  undefined4 local_8d4;
  shared_ptr<nigel::Token> local_8d0;
  undefined4 local_8bc;
  shared_ptr<nigel::Token> local_8b8;
  undefined4 local_8a4;
  shared_ptr<nigel::Token> local_8a0;
  undefined4 local_88c;
  shared_ptr<nigel::Token> local_888;
  undefined4 local_874;
  shared_ptr<nigel::Token> local_870;
  undefined4 local_85c;
  shared_ptr<nigel::Token> local_858;
  undefined4 local_844;
  shared_ptr<nigel::Token> local_840;
  undefined4 local_82c;
  shared_ptr<nigel::Token> local_828;
  undefined4 local_814;
  shared_ptr<nigel::Token> local_810;
  undefined4 local_7fc;
  shared_ptr<nigel::Token> local_7f8;
  undefined4 local_7e4;
  shared_ptr<nigel::Token> local_7e0;
  undefined4 local_7cc;
  shared_ptr<nigel::Token> local_7c8;
  undefined1 local_7b8 [16];
  undefined1 local_7a8 [8];
  String identifier_2;
  shared_ptr<nigel::Token> local_780;
  undefined4 local_76c;
  shared_ptr<nigel::Token> local_768;
  undefined4 local_754;
  shared_ptr<nigel::Token> local_750;
  undefined4 local_73c;
  shared_ptr<nigel::Token> local_738;
  undefined4 local_724;
  shared_ptr<nigel::Token> local_720;
  undefined4 local_70c;
  shared_ptr<nigel::Token> local_708;
  undefined4 local_6f4;
  shared_ptr<nigel::Token> local_6f0;
  undefined4 local_6dc;
  shared_ptr<nigel::Token> local_6d8;
  undefined4 local_6c4;
  shared_ptr<nigel::Token> local_6c0;
  undefined4 local_6ac;
  shared_ptr<nigel::Token> local_6a8;
  undefined4 local_694;
  shared_ptr<nigel::Token> local_690;
  undefined4 local_67c;
  shared_ptr<nigel::Token> local_678;
  undefined4 local_664;
  shared_ptr<nigel::Token> local_660;
  undefined4 local_64c;
  shared_ptr<nigel::Token> local_648;
  undefined4 local_634;
  shared_ptr<nigel::Token> local_630;
  undefined4 local_61c;
  shared_ptr<nigel::Token> local_618;
  undefined4 local_604;
  shared_ptr<nigel::Token> local_600;
  undefined4 local_5ec;
  shared_ptr<nigel::Token> local_5e8;
  undefined4 local_5d4;
  shared_ptr<nigel::Token> local_5d0;
  undefined4 local_5bc;
  shared_ptr<nigel::Token> local_5b8;
  byte local_5a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  byte local_579;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  byte local_551;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  byte local_529;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  byte local_501;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  byte local_4d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  byte local_4b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  byte local_489;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  byte local_461;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  byte local_439;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  byte local_411;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  byte local_3e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  byte local_3c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  byte local_399;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  byte local_371;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  byte local_349;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  byte local_321;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  byte local_2d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  undefined1 local_298 [16];
  undefined1 local_288 [8];
  String identifier_1;
  shared_ptr<nigel::Token> local_260;
  undefined4 local_24c;
  shared_ptr<nigel::Token> local_248;
  undefined4 local_234;
  shared_ptr<nigel::Token> local_230;
  undefined4 local_21c;
  shared_ptr<nigel::Token> local_218;
  undefined4 local_204;
  shared_ptr<nigel::Token> local_200;
  undefined4 local_1ec;
  shared_ptr<nigel::Token> local_1e8;
  undefined4 local_1d4;
  shared_ptr<nigel::Token> local_1d0;
  undefined4 local_1bc;
  shared_ptr<nigel::Token> local_1b8;
  undefined4 local_1a4;
  shared_ptr<nigel::Token> local_1a0;
  undefined4 local_18c;
  shared_ptr<nigel::Token> local_188;
  undefined4 local_174;
  shared_ptr<nigel::Token> local_170;
  undefined4 local_15c;
  shared_ptr<nigel::Token> local_158;
  undefined4 local_144;
  shared_ptr<nigel::Token> local_140;
  undefined4 local_12c;
  shared_ptr<nigel::Token> local_128;
  undefined4 local_114;
  shared_ptr<nigel::Token> local_110;
  undefined4 local_fc;
  shared_ptr<nigel::Token> local_f8;
  undefined4 local_e4;
  shared_ptr<nigel::Token> local_e0;
  undefined4 local_cc;
  shared_ptr<nigel::Token> local_c8;
  undefined4 local_b4;
  shared_ptr<nigel::Token> local_b0 [2];
  undefined1 local_90 [16];
  undefined1 local_80 [8];
  String identifier;
  _Self local_58;
  iterator token;
  list<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
  toRemove;
  shared_ptr<nigel::Token> tmp2;
  shared_ptr<nigel::Token> tmp;
  CodeBase *base_local;
  Lexer *this_local;
  
  std::shared_ptr<nigel::Token>::shared_ptr
            ((shared_ptr<nigel::Token> *)
             &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<nigel::Token>::shared_ptr
            ((shared_ptr<nigel::Token> *)
             &toRemove.
              super__List_base<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
              ._M_impl._M_node._M_size);
  std::__cxx11::
  list<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
  ::list((list<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
          *)&token);
  local_58._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>::begin
                 (&base->lexerStruct);
  while( true ) {
    identifier.field_2._8_8_ =
         std::__cxx11::
         list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>::end
                   (&base->lexerStruct);
    bVar3 = std::operator!=(&local_58,(_Self *)((long)&identifier.field_2 + 8));
    if (!bVar3) break;
    p_Var4 = (__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator*(&local_58);
    peVar5 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var4);
    if (peVar5->type == identifier) {
      p_Var4 = (__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator*(&local_58);
      std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                (p_Var4);
      Token::as<nigel::Token_Identifier>((Token *)local_90);
      peVar6 = std::
               __shared_ptr_access<const_nigel::Token_Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_nigel::Token_Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_90);
      std::__cxx11::string::string((string *)local_80,(string *)&peVar6->identifier);
      std::shared_ptr<const_nigel::Token_Identifier>::~shared_ptr
                ((shared_ptr<const_nigel::Token_Identifier> *)local_90);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_80,"_EOF_");
      if (bVar3) {
        local_b4 = 1;
        std::make_shared<nigel::Token,nigel::Token::Type>((Type *)local_b0);
        std::shared_ptr<nigel::Token>::operator=
                  ((shared_ptr<nigel::Token> *)
                   &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   local_b0);
        std::shared_ptr<nigel::Token>::~shared_ptr(local_b0);
        p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)->
                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
        std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                  (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                          &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_80,"fn");
        if (bVar3) {
          local_cc = 4;
          std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_c8);
          std::shared_ptr<nigel::Token>::operator=
                    ((shared_ptr<nigel::Token> *)
                     &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     &local_c8);
          std::shared_ptr<nigel::Token>::~shared_ptr(&local_c8);
          p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)->
                    super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
          std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                    (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                            &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
        }
        else {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_80,"byte");
          if (bVar3) {
            local_e4 = 5;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_e0);
            std::shared_ptr<nigel::Token>::operator=
                      ((shared_ptr<nigel::Token> *)
                       &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&local_e0);
            std::shared_ptr<nigel::Token>::~shared_ptr(&local_e0);
            p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)->
                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                      (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                              &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
          }
          else {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_80,"int");
            if (bVar3) {
              local_fc = 6;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_f8);
              std::shared_ptr<nigel::Token>::operator=
                        ((shared_ptr<nigel::Token> *)
                         &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,&local_f8);
              std::shared_ptr<nigel::Token>::~shared_ptr(&local_f8);
              p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)->
                        super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
              std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                        (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                                &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount);
            }
            else {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_80,"unsigned");
              if (bVar3) {
                local_114 = 7;
                std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_110);
                std::shared_ptr<nigel::Token>::operator=
                          ((shared_ptr<nigel::Token> *)
                           &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,&local_110);
                std::shared_ptr<nigel::Token>::~shared_ptr(&local_110);
                p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)
                          ->super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
                std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                          (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                                  &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
              }
              else {
                bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_80,"fast");
                if (bVar3) {
                  local_12c = 8;
                  std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_128);
                  std::shared_ptr<nigel::Token>::operator=
                            ((shared_ptr<nigel::Token> *)
                             &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,&local_128);
                  std::shared_ptr<nigel::Token>::~shared_ptr(&local_128);
                  p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->
                                      (&local_58)->
                            super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
                  std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                            (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                                    &tmp2.
                                     super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount);
                }
                else {
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_80,"norm");
                  if (bVar3) {
                    local_144 = 9;
                    std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_140);
                    std::shared_ptr<nigel::Token>::operator=
                              ((shared_ptr<nigel::Token> *)
                               &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,&local_140);
                    std::shared_ptr<nigel::Token>::~shared_ptr(&local_140);
                    p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->
                                        (&local_58)->
                              super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
                    std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                              (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                                      &tmp2.
                                       super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount);
                  }
                  else {
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_80,"ptr");
                    if (bVar3) {
                      local_15c = 10;
                      std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_158);
                      std::shared_ptr<nigel::Token>::operator=
                                ((shared_ptr<nigel::Token> *)
                                 &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,&local_158);
                      std::shared_ptr<nigel::Token>::~shared_ptr(&local_158);
                      p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->
                                          (&local_58)->
                                super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
                      std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                                (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                                        &tmp2.
                                         super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount);
                    }
                    else {
                      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_80,"if");
                      if (bVar3) {
                        local_174 = 0xb;
                        std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_170);
                        std::shared_ptr<nigel::Token>::operator=
                                  ((shared_ptr<nigel::Token> *)
                                   &tmp2.
                                    super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount,&local_170);
                        std::shared_ptr<nigel::Token>::~shared_ptr(&local_170);
                        p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->
                                            (&local_58)->
                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
                        std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                                  (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                                          &tmp2.
                                           super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount);
                      }
                      else {
                        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_80,"else");
                        if (bVar3) {
                          local_18c = 0xc;
                          std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_188);
                          std::shared_ptr<nigel::Token>::operator=
                                    ((shared_ptr<nigel::Token> *)
                                     &tmp2.
                                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount,&local_188);
                          std::shared_ptr<nigel::Token>::~shared_ptr(&local_188);
                          p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->
                                              (&local_58)->
                                    super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
                          std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                                    (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                             *)&tmp2.
                                                super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount);
                        }
                        else {
                          bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"while");
                          if (bVar3) {
                            local_1a4 = 0xd;
                            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_1a0);
                            std::shared_ptr<nigel::Token>::operator=
                                      ((shared_ptr<nigel::Token> *)
                                       &tmp2.
                                        super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount,&local_1a0);
                            std::shared_ptr<nigel::Token>::~shared_ptr(&local_1a0);
                            p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::
                                      operator->(&local_58)->
                                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
                            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                                      (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                               *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                          }
                          else {
                            bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"for");
                            if (bVar3) {
                              local_1bc = 0xe;
                              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_1b8);
                              std::shared_ptr<nigel::Token>::operator=
                                        ((shared_ptr<nigel::Token> *)
                                         &tmp2.
                                          super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount,&local_1b8);
                              std::shared_ptr<nigel::Token>::~shared_ptr(&local_1b8);
                              p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::
                                        operator->(&local_58)->
                                        super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                              ;
                              std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                                        (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                 *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                            }
                            else {
                              bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"do");
                              if (bVar3) {
                                local_1d4 = 0xf;
                                std::make_shared<nigel::Token,nigel::Token::Type>
                                          ((Type *)&local_1d0);
                                std::shared_ptr<nigel::Token>::operator=
                                          ((shared_ptr<nigel::Token> *)
                                           &tmp2.
                                            super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount,&local_1d0);
                                std::shared_ptr<nigel::Token>::~shared_ptr(&local_1d0);
                                p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::
                                          operator->(&local_58)->
                                          super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                ;
                                std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                                          (p_Var7,(
                                                  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                              }
                              else {
                                bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"break");
                                if (bVar3) {
                                  local_1ec = 0x10;
                                  std::make_shared<nigel::Token,nigel::Token::Type>
                                            ((Type *)&local_1e8);
                                  std::shared_ptr<nigel::Token>::operator=
                                            ((shared_ptr<nigel::Token> *)
                                             &tmp2.
                                              super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount,&local_1e8);
                                  std::shared_ptr<nigel::Token>::~shared_ptr(&local_1e8);
                                  p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::
                                            operator->(&local_58)->
                                            super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                  ;
                                  std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                                            (p_Var7,(
                                                  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                }
                                else {
                                  bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"return");
                                  if (bVar3) {
                                    local_204 = 0x11;
                                    std::make_shared<nigel::Token,nigel::Token::Type>
                                              ((Type *)&local_200);
                                    std::shared_ptr<nigel::Token>::operator=
                                              ((shared_ptr<nigel::Token> *)
                                               &tmp2.
                                                super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount,&local_200);
                                    std::shared_ptr<nigel::Token>::~shared_ptr(&local_200);
                                    p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::
                                              operator->(&local_58)->
                                              super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                    ;
                                    std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::
                                    swap(p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                 *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                  }
                                  else {
                                    bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"new");
                                    if (bVar3) {
                                      local_21c = 0x12;
                                      std::make_shared<nigel::Token,nigel::Token::Type>
                                                ((Type *)&local_218);
                                      std::shared_ptr<nigel::Token>::operator=
                                                ((shared_ptr<nigel::Token> *)
                                                 &tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount,&local_218);
                                      std::shared_ptr<nigel::Token>::~shared_ptr(&local_218);
                                      p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>
                                                ::operator->(&local_58)->
                                                super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                      ;
                                      std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::
                                      swap(p_Var7,(
                                                  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                    }
                                    else {
                                      bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"delete");
                                      if (bVar3) {
                                        local_234 = 0x13;
                                        std::make_shared<nigel::Token,nigel::Token::Type>
                                                  ((Type *)&local_230);
                                        std::shared_ptr<nigel::Token>::operator=
                                                  ((shared_ptr<nigel::Token> *)
                                                   &tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount,&local_230);
                                        std::shared_ptr<nigel::Token>::~shared_ptr(&local_230);
                                        p_Var7 = &std::
                                                  _List_iterator<std::shared_ptr<nigel::Token>_>::
                                                  operator->(&local_58)->
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                        ;
                                        std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                        ::swap(p_Var7,(
                                                  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                      }
                                      else {
                                        bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"true");
                                        if (bVar3) {
                                          local_24c = 0x16;
                                          std::make_shared<nigel::Token,nigel::Token::Type>
                                                    ((Type *)&local_248);
                                          std::shared_ptr<nigel::Token>::operator=
                                                    ((shared_ptr<nigel::Token> *)
                                                     &tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount,&local_248);
                                          std::shared_ptr<nigel::Token>::~shared_ptr(&local_248);
                                          p_Var7 = &std::
                                                  _List_iterator<std::shared_ptr<nigel::Token>_>::
                                                  operator->(&local_58)->
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                          ;
                                          std::
                                          __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::
                                          swap(p_Var7,(
                                                  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                        }
                                        else {
                                          bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"false");
                                          if (bVar3) {
                                            identifier_1.field_2._12_4_ = 0x17;
                                            std::make_shared<nigel::Token,nigel::Token::Type>
                                                      ((Type *)&local_260);
                                            std::shared_ptr<nigel::Token>::operator=
                                                      ((shared_ptr<nigel::Token> *)
                                                       &tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount,&local_260);
                                            std::shared_ptr<nigel::Token>::~shared_ptr(&local_260);
                                            p_Var7 = &std::
                                                  _List_iterator<std::shared_ptr<nigel::Token>_>::
                                                  operator->(&local_58)->
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                            ;
                                            std::
                                            __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::
                                            swap(p_Var7,(
                                                  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)local_80);
    }
    else {
      p_Var4 = (__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator*(&local_58);
      peVar5 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var4);
      if (peVar5->type == operatorToken) {
        p_Var4 = (__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator*(&local_58);
        std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  (p_Var4);
        Token::as<nigel::Token_Operator>((Token *)local_298);
        peVar8 = std::
                 __shared_ptr_access<const_nigel::Token_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_nigel::Token_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_298);
        std::__cxx11::string::string((string *)local_288,(string *)&peVar8->operatorToken);
        std::shared_ptr<const_nigel::Token_Operator>::~shared_ptr
                  ((shared_ptr<const_nigel::Token_Operator> *)local_298);
        uVar9 = std::__cxx11::string::size();
        if (1 < uVar9) {
          local_2d9 = 0;
          std::__cxx11::string::substr((ulong)&local_2b8,(ulong)local_288);
          bVar3 = std::operator==(&local_2b8,"<<=");
          local_ae5 = true;
          if (!bVar3) {
            std::__cxx11::string::substr((ulong)&local_2d8,(ulong)local_288);
            local_2d9 = 1;
            local_ae5 = std::operator==(&local_2d8,">>=");
          }
          if ((local_2d9 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_2d8);
          }
          std::__cxx11::string::~string((string *)&local_2b8);
          if (local_ae5 == false) {
            local_321 = 0;
            local_349 = 0;
            local_371 = 0;
            local_399 = 0;
            local_3c1 = 0;
            local_3e9 = 0;
            local_411 = 0;
            local_439 = 0;
            local_461 = 0;
            local_489 = 0;
            local_4b1 = 0;
            local_4d9 = 0;
            local_501 = 0;
            local_529 = 0;
            local_551 = 0;
            local_579 = 0;
            local_5a1 = 0;
            std::__cxx11::string::substr((ulong)&local_300,(ulong)local_288);
            bVar3 = std::operator==(&local_300,"&&");
            local_ae9 = true;
            if (!bVar3) {
              std::__cxx11::string::substr((ulong)&local_320,(ulong)local_288);
              local_321 = 1;
              bVar3 = std::operator==(&local_320,"||");
              local_ae9 = true;
              if (!bVar3) {
                std::__cxx11::string::substr((ulong)&local_348,(ulong)local_288);
                local_349 = 1;
                bVar3 = std::operator==(&local_348,"<<");
                local_ae9 = true;
                if (!bVar3) {
                  std::__cxx11::string::substr((ulong)&local_370,(ulong)local_288);
                  local_371 = 1;
                  bVar3 = std::operator==(&local_370,">>");
                  local_ae9 = true;
                  if (!bVar3) {
                    std::__cxx11::string::substr((ulong)&local_398,(ulong)local_288);
                    local_399 = 1;
                    bVar3 = std::operator==(&local_398,">=");
                    local_ae9 = true;
                    if (!bVar3) {
                      std::__cxx11::string::substr((ulong)&local_3c0,(ulong)local_288);
                      local_3c1 = 1;
                      bVar3 = std::operator==(&local_3c0,"<=");
                      local_ae9 = true;
                      if (!bVar3) {
                        std::__cxx11::string::substr((ulong)&local_3e8,(ulong)local_288);
                        local_3e9 = 1;
                        bVar3 = std::operator==(&local_3e8,"++");
                        local_ae9 = true;
                        if (!bVar3) {
                          std::__cxx11::string::substr((ulong)&local_410,(ulong)local_288);
                          local_411 = 1;
                          bVar3 = std::operator==(&local_410,"--");
                          local_ae9 = true;
                          if (!bVar3) {
                            std::__cxx11::string::substr((ulong)&local_438,(ulong)local_288);
                            local_439 = 1;
                            bVar3 = std::operator==(&local_438,"==");
                            local_ae9 = true;
                            if (!bVar3) {
                              std::__cxx11::string::substr((ulong)&local_460,(ulong)local_288);
                              local_461 = 1;
                              bVar3 = std::operator==(&local_460,"!=");
                              local_ae9 = true;
                              if (!bVar3) {
                                std::__cxx11::string::substr((ulong)&local_488,(ulong)local_288);
                                local_489 = 1;
                                bVar3 = std::operator==(&local_488,"+=");
                                local_ae9 = true;
                                if (!bVar3) {
                                  std::__cxx11::string::substr((ulong)&local_4b0,(ulong)local_288);
                                  local_4b1 = 1;
                                  bVar3 = std::operator==(&local_4b0,"-=");
                                  local_ae9 = true;
                                  if (!bVar3) {
                                    std::__cxx11::string::substr((ulong)&local_4d8,(ulong)local_288)
                                    ;
                                    local_4d9 = 1;
                                    bVar3 = std::operator==(&local_4d8,"*=");
                                    local_ae9 = true;
                                    if (!bVar3) {
                                      std::__cxx11::string::substr
                                                ((ulong)&local_500,(ulong)local_288);
                                      local_501 = 1;
                                      bVar3 = std::operator==(&local_500,"/=");
                                      local_ae9 = true;
                                      if (!bVar3) {
                                        std::__cxx11::string::substr
                                                  ((ulong)&local_528,(ulong)local_288);
                                        local_529 = 1;
                                        bVar3 = std::operator==(&local_528,"%=");
                                        local_ae9 = true;
                                        if (!bVar3) {
                                          std::__cxx11::string::substr
                                                    ((ulong)&local_550,(ulong)local_288);
                                          local_551 = 1;
                                          bVar3 = std::operator==(&local_550,"&=");
                                          local_ae9 = true;
                                          if (!bVar3) {
                                            std::__cxx11::string::substr
                                                      ((ulong)&local_578,(ulong)local_288);
                                            local_579 = 1;
                                            bVar3 = std::operator==(&local_578,"|=");
                                            local_ae9 = true;
                                            if (!bVar3) {
                                              std::__cxx11::string::substr
                                                        ((ulong)&local_5a0,(ulong)local_288);
                                              local_5a1 = 1;
                                              local_ae9 = std::operator==(&local_5a0,"^=");
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            if ((local_5a1 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_5a0);
            }
            if ((local_579 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_578);
            }
            if ((local_551 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_550);
            }
            if ((local_529 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_528);
            }
            if ((local_501 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_500);
            }
            if ((local_4d9 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_4d8);
            }
            if ((local_4b1 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_4b0);
            }
            if ((local_489 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_488);
            }
            if ((local_461 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_460);
            }
            if ((local_439 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_438);
            }
            if ((local_411 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_410);
            }
            if ((local_3e9 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_3e8);
            }
            if ((local_3c1 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_3c0);
            }
            if ((local_399 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_398);
            }
            if ((local_371 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_370);
            }
            if ((local_349 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_348);
            }
            if ((local_321 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_320);
            }
            std::__cxx11::string::~string((string *)&local_300);
            if ((local_ae9 != false) && (uVar9 = std::__cxx11::string::size(), 2 < uVar9)) {
              splitToken(this,(String *)local_288,2,&local_58,&base->lexerStruct);
            }
          }
          else {
            uVar9 = std::__cxx11::string::size();
            if (3 < uVar9) {
              splitToken(this,(String *)local_288,3,&local_58,&base->lexerStruct);
            }
          }
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_288,"+=");
          if (bVar3) {
            local_5bc = 0x2f;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_5b8);
            std::shared_ptr<nigel::Token>::operator=
                      ((shared_ptr<nigel::Token> *)
                       &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&local_5b8);
            std::shared_ptr<nigel::Token>::~shared_ptr(&local_5b8);
            p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)->
                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                      (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                              &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
          }
          else {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_288,"-=");
            if (bVar3) {
              local_5d4 = 0x30;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_5d0);
              std::shared_ptr<nigel::Token>::operator=
                        ((shared_ptr<nigel::Token> *)
                         &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,&local_5d0);
              std::shared_ptr<nigel::Token>::~shared_ptr(&local_5d0);
              p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)->
                        super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
              std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                        (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                                &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount);
            }
            else {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_288,"*=");
              if (bVar3) {
                local_5ec = 0x31;
                std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_5e8);
                std::shared_ptr<nigel::Token>::operator=
                          ((shared_ptr<nigel::Token> *)
                           &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,&local_5e8);
                std::shared_ptr<nigel::Token>::~shared_ptr(&local_5e8);
                p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)
                          ->super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
                std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                          (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                                  &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
              }
              else {
                bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_288,"/=");
                if (bVar3) {
                  local_604 = 0x32;
                  std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_600);
                  std::shared_ptr<nigel::Token>::operator=
                            ((shared_ptr<nigel::Token> *)
                             &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,&local_600);
                  std::shared_ptr<nigel::Token>::~shared_ptr(&local_600);
                  p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->
                                      (&local_58)->
                            super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
                  std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                            (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                                    &tmp2.
                                     super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount);
                }
                else {
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_288,"%=");
                  if (bVar3) {
                    local_61c = 0x33;
                    std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_618);
                    std::shared_ptr<nigel::Token>::operator=
                              ((shared_ptr<nigel::Token> *)
                               &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,&local_618);
                    std::shared_ptr<nigel::Token>::~shared_ptr(&local_618);
                    p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->
                                        (&local_58)->
                              super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
                    std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                              (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                                      &tmp2.
                                       super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount);
                  }
                  else {
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_288,"==");
                    if (bVar3) {
                      local_634 = 0x1e;
                      std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_630);
                      std::shared_ptr<nigel::Token>::operator=
                                ((shared_ptr<nigel::Token> *)
                                 &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,&local_630);
                      std::shared_ptr<nigel::Token>::~shared_ptr(&local_630);
                      p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->
                                          (&local_58)->
                                super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
                      std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                                (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                                        &tmp2.
                                         super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount);
                    }
                    else {
                      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_288,"!=");
                      if (bVar3) {
                        local_64c = 0x1f;
                        std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_648);
                        std::shared_ptr<nigel::Token>::operator=
                                  ((shared_ptr<nigel::Token> *)
                                   &tmp2.
                                    super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount,&local_648);
                        std::shared_ptr<nigel::Token>::~shared_ptr(&local_648);
                        p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->
                                            (&local_58)->
                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
                        std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                                  (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                                          &tmp2.
                                           super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount);
                      }
                      else {
                        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_288,"<=");
                        if (bVar3) {
                          local_664 = 0x22;
                          std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_660);
                          std::shared_ptr<nigel::Token>::operator=
                                    ((shared_ptr<nigel::Token> *)
                                     &tmp2.
                                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount,&local_660);
                          std::shared_ptr<nigel::Token>::~shared_ptr(&local_660);
                          p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->
                                              (&local_58)->
                                    super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
                          std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                                    (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                             *)&tmp2.
                                                super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount);
                        }
                        else {
                          bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_288,">=");
                          if (bVar3) {
                            local_67c = 0x23;
                            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_678);
                            std::shared_ptr<nigel::Token>::operator=
                                      ((shared_ptr<nigel::Token> *)
                                       &tmp2.
                                        super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount,&local_678);
                            std::shared_ptr<nigel::Token>::~shared_ptr(&local_678);
                            p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::
                                      operator->(&local_58)->
                                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
                            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                                      (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                               *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                          }
                          else {
                            bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_288,"&=");
                            if (bVar3) {
                              local_694 = 0x36;
                              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_690);
                              std::shared_ptr<nigel::Token>::operator=
                                        ((shared_ptr<nigel::Token> *)
                                         &tmp2.
                                          super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount,&local_690);
                              std::shared_ptr<nigel::Token>::~shared_ptr(&local_690);
                              p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::
                                        operator->(&local_58)->
                                        super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                              ;
                              std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                                        (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                 *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                            }
                            else {
                              bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_288,"|=");
                              if (bVar3) {
                                local_6ac = 0x37;
                                std::make_shared<nigel::Token,nigel::Token::Type>
                                          ((Type *)&local_6a8);
                                std::shared_ptr<nigel::Token>::operator=
                                          ((shared_ptr<nigel::Token> *)
                                           &tmp2.
                                            super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount,&local_6a8);
                                std::shared_ptr<nigel::Token>::~shared_ptr(&local_6a8);
                                p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::
                                          operator->(&local_58)->
                                          super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                ;
                                std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                                          (p_Var7,(
                                                  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                              }
                              else {
                                bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_288,"^=");
                                if (bVar3) {
                                  local_6c4 = 0x38;
                                  std::make_shared<nigel::Token,nigel::Token::Type>
                                            ((Type *)&local_6c0);
                                  std::shared_ptr<nigel::Token>::operator=
                                            ((shared_ptr<nigel::Token> *)
                                             &tmp2.
                                              super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount,&local_6c0);
                                  std::shared_ptr<nigel::Token>::~shared_ptr(&local_6c0);
                                  p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::
                                            operator->(&local_58)->
                                            super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                  ;
                                  std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                                            (p_Var7,(
                                                  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                }
                                else {
                                  bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_288,"&&");
                                  if (bVar3) {
                                    local_6dc = 0x28;
                                    std::make_shared<nigel::Token,nigel::Token::Type>
                                              ((Type *)&local_6d8);
                                    std::shared_ptr<nigel::Token>::operator=
                                              ((shared_ptr<nigel::Token> *)
                                               &tmp2.
                                                super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount,&local_6d8);
                                    std::shared_ptr<nigel::Token>::~shared_ptr(&local_6d8);
                                    p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::
                                              operator->(&local_58)->
                                              super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                    ;
                                    std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::
                                    swap(p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                 *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                  }
                                  else {
                                    bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_288,"||");
                                    if (bVar3) {
                                      local_6f4 = 0x2a;
                                      std::make_shared<nigel::Token,nigel::Token::Type>
                                                ((Type *)&local_6f0);
                                      std::shared_ptr<nigel::Token>::operator=
                                                ((shared_ptr<nigel::Token> *)
                                                 &tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount,&local_6f0);
                                      std::shared_ptr<nigel::Token>::~shared_ptr(&local_6f0);
                                      p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>
                                                ::operator->(&local_58)->
                                                super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                      ;
                                      std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::
                                      swap(p_Var7,(
                                                  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                    }
                                    else {
                                      bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_288,"<<");
                                      if (bVar3) {
                                        local_70c = 0x24;
                                        std::make_shared<nigel::Token,nigel::Token::Type>
                                                  ((Type *)&local_708);
                                        std::shared_ptr<nigel::Token>::operator=
                                                  ((shared_ptr<nigel::Token> *)
                                                   &tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount,&local_708);
                                        std::shared_ptr<nigel::Token>::~shared_ptr(&local_708);
                                        p_Var7 = &std::
                                                  _List_iterator<std::shared_ptr<nigel::Token>_>::
                                                  operator->(&local_58)->
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                        ;
                                        std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                        ::swap(p_Var7,(
                                                  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                      }
                                      else {
                                        bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_288,">>");
                                        if (bVar3) {
                                          local_724 = 0x25;
                                          std::make_shared<nigel::Token,nigel::Token::Type>
                                                    ((Type *)&local_720);
                                          std::shared_ptr<nigel::Token>::operator=
                                                    ((shared_ptr<nigel::Token> *)
                                                     &tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount,&local_720);
                                          std::shared_ptr<nigel::Token>::~shared_ptr(&local_720);
                                          p_Var7 = &std::
                                                  _List_iterator<std::shared_ptr<nigel::Token>_>::
                                                  operator->(&local_58)->
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                          ;
                                          std::
                                          __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::
                                          swap(p_Var7,(
                                                  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                        }
                                        else {
                                          bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_288,"<<=");
                                          if (bVar3) {
                                            local_73c = 0x34;
                                            std::make_shared<nigel::Token,nigel::Token::Type>
                                                      ((Type *)&local_738);
                                            std::shared_ptr<nigel::Token>::operator=
                                                      ((shared_ptr<nigel::Token> *)
                                                       &tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount,&local_738);
                                            std::shared_ptr<nigel::Token>::~shared_ptr(&local_738);
                                            p_Var7 = &std::
                                                  _List_iterator<std::shared_ptr<nigel::Token>_>::
                                                  operator->(&local_58)->
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                            ;
                                            std::
                                            __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::
                                            swap(p_Var7,(
                                                  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                          }
                                          else {
                                            bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_288,">>=");
                                            if (bVar3) {
                                              local_754 = 0x35;
                                              std::make_shared<nigel::Token,nigel::Token::Type>
                                                        ((Type *)&local_750);
                                              std::shared_ptr<nigel::Token>::operator=
                                                        ((shared_ptr<nigel::Token> *)
                                                         &tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount,&local_750);
                                              std::shared_ptr<nigel::Token>::~shared_ptr(&local_750)
                                              ;
                                              p_Var7 = &std::
                                                  _List_iterator<std::shared_ptr<nigel::Token>_>::
                                                  operator->(&local_58)->
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                              ;
                                              std::
                                              __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                              ::swap(p_Var7,(
                                                  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                            }
                                            else {
                                              bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_288,"++");
                                              if (bVar3) {
                                                local_76c = 0x39;
                                                std::make_shared<nigel::Token,nigel::Token::Type>
                                                          ((Type *)&local_768);
                                                std::shared_ptr<nigel::Token>::operator=
                                                          ((shared_ptr<nigel::Token> *)
                                                           &tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount,&local_768);
                                                std::shared_ptr<nigel::Token>::~shared_ptr
                                                          (&local_768);
                                                p_Var7 = &std::
                                                  _List_iterator<std::shared_ptr<nigel::Token>_>::
                                                  operator->(&local_58)->
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                ;
                                                std::
                                                __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                ::swap(p_Var7,(
                                                  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                              }
                                              else {
                                                bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_288,"--");
                                                if (bVar3) {
                                                  identifier_2.field_2._12_4_ = 0x3a;
                                                  std::make_shared<nigel::Token,nigel::Token::Type>
                                                            ((Type *)&local_780);
                                                  std::shared_ptr<nigel::Token>::operator=
                                                            ((shared_ptr<nigel::Token> *)
                                                             &tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount,&local_780);
                                                  std::shared_ptr<nigel::Token>::~shared_ptr
                                                            (&local_780);
                                                  p_Var7 = &std::
                                                  _List_iterator<std::shared_ptr<nigel::Token>_>::
                                                  operator->(&local_58)->
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ;
                                                  std::
                                                  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ::swap(p_Var7,(
                                                  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                }
                                                else {
                                                  splitToken(this,(String *)local_288,1,&local_58,
                                                             &base->lexerStruct);
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        lVar10 = std::__cxx11::string::size();
        if (lVar10 == 1) {
          p_Var4 = (__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator*(&local_58);
          std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->(p_Var4);
          Token::as<nigel::Token_Operator>((Token *)local_7b8);
          peVar8 = std::
                   __shared_ptr_access<const_nigel::Token_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_nigel::Token_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_7b8);
          std::__cxx11::string::string((string *)local_7a8,(string *)&peVar8->operatorToken);
          std::shared_ptr<const_nigel::Token_Operator>::~shared_ptr
                    ((shared_ptr<const_nigel::Token_Operator> *)local_7b8);
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_7a8,"+");
          if (bVar3) {
            local_7cc = 0x19;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_7c8);
            std::shared_ptr<nigel::Token>::operator=
                      ((shared_ptr<nigel::Token> *)
                       &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&local_7c8);
            std::shared_ptr<nigel::Token>::~shared_ptr(&local_7c8);
            p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)->
                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                      (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                              &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
          }
          else {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_7a8,"-");
            if (bVar3) {
              local_7e4 = 0x1a;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_7e0);
              std::shared_ptr<nigel::Token>::operator=
                        ((shared_ptr<nigel::Token> *)
                         &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,&local_7e0);
              std::shared_ptr<nigel::Token>::~shared_ptr(&local_7e0);
              p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)->
                        super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
              std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                        (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                                &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount);
            }
            else {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_7a8,"*");
              if (bVar3) {
                local_7fc = 0x1b;
                std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_7f8);
                std::shared_ptr<nigel::Token>::operator=
                          ((shared_ptr<nigel::Token> *)
                           &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,&local_7f8);
                std::shared_ptr<nigel::Token>::~shared_ptr(&local_7f8);
                p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)
                          ->super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
                std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                          (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                                  &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
              }
              else {
                bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_7a8,"/");
                if (bVar3) {
                  local_814 = 0x1c;
                  std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_810);
                  std::shared_ptr<nigel::Token>::operator=
                            ((shared_ptr<nigel::Token> *)
                             &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,&local_810);
                  std::shared_ptr<nigel::Token>::~shared_ptr(&local_810);
                  p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->
                                      (&local_58)->
                            super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
                  std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                            (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                                    &tmp2.
                                     super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount);
                }
                else {
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_7a8,"%");
                  if (bVar3) {
                    local_82c = 0x1d;
                    std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_828);
                    std::shared_ptr<nigel::Token>::operator=
                              ((shared_ptr<nigel::Token> *)
                               &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,&local_828);
                    std::shared_ptr<nigel::Token>::~shared_ptr(&local_828);
                    p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->
                                        (&local_58)->
                              super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
                    std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                              (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                                      &tmp2.
                                       super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount);
                  }
                  else {
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_7a8,"=");
                    if (bVar3) {
                      local_844 = 0x2d;
                      std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_840);
                      std::shared_ptr<nigel::Token>::operator=
                                ((shared_ptr<nigel::Token> *)
                                 &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,&local_840);
                      std::shared_ptr<nigel::Token>::~shared_ptr(&local_840);
                      p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->
                                          (&local_58)->
                                super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
                      std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                                (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                                        &tmp2.
                                         super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount);
                    }
                    else {
                      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_7a8,"<");
                      if (bVar3) {
                        local_85c = 0x20;
                        std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_858);
                        std::shared_ptr<nigel::Token>::operator=
                                  ((shared_ptr<nigel::Token> *)
                                   &tmp2.
                                    super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount,&local_858);
                        std::shared_ptr<nigel::Token>::~shared_ptr(&local_858);
                        p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->
                                            (&local_58)->
                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
                        std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                                  (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                                          &tmp2.
                                           super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount);
                      }
                      else {
                        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_7a8,">");
                        if (bVar3) {
                          local_874 = 0x21;
                          std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_870);
                          std::shared_ptr<nigel::Token>::operator=
                                    ((shared_ptr<nigel::Token> *)
                                     &tmp2.
                                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount,&local_870);
                          std::shared_ptr<nigel::Token>::~shared_ptr(&local_870);
                          p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->
                                              (&local_58)->
                                    super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
                          std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                                    (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                             *)&tmp2.
                                                super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount);
                        }
                        else {
                          bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_7a8,"!");
                          if (bVar3) {
                            local_88c = 0x26;
                            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_888);
                            std::shared_ptr<nigel::Token>::operator=
                                      ((shared_ptr<nigel::Token> *)
                                       &tmp2.
                                        super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount,&local_888);
                            std::shared_ptr<nigel::Token>::~shared_ptr(&local_888);
                            p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::
                                      operator->(&local_58)->
                                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
                            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                                      (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                               *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                          }
                          else {
                            bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_7a8,"&");
                            if (bVar3) {
                              local_8a4 = 0x27;
                              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_8a0);
                              std::shared_ptr<nigel::Token>::operator=
                                        ((shared_ptr<nigel::Token> *)
                                         &tmp2.
                                          super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount,&local_8a0);
                              std::shared_ptr<nigel::Token>::~shared_ptr(&local_8a0);
                              p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::
                                        operator->(&local_58)->
                                        super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                              ;
                              std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                                        (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                 *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                            }
                            else {
                              bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_7a8,"|");
                              if (bVar3) {
                                local_8bc = 0x29;
                                std::make_shared<nigel::Token,nigel::Token::Type>
                                          ((Type *)&local_8b8);
                                std::shared_ptr<nigel::Token>::operator=
                                          ((shared_ptr<nigel::Token> *)
                                           &tmp2.
                                            super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount,&local_8b8);
                                std::shared_ptr<nigel::Token>::~shared_ptr(&local_8b8);
                                p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::
                                          operator->(&local_58)->
                                          super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                ;
                                std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                                          (p_Var7,(
                                                  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                              }
                              else {
                                bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_7a8,"^");
                                if (bVar3) {
                                  local_8d4 = 0x2b;
                                  std::make_shared<nigel::Token,nigel::Token::Type>
                                            ((Type *)&local_8d0);
                                  std::shared_ptr<nigel::Token>::operator=
                                            ((shared_ptr<nigel::Token> *)
                                             &tmp2.
                                              super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount,&local_8d0);
                                  std::shared_ptr<nigel::Token>::~shared_ptr(&local_8d0);
                                  p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::
                                            operator->(&local_58)->
                                            super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                  ;
                                  std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                                            (p_Var7,(
                                                  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                }
                                else {
                                  bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_7a8,"~");
                                  if (bVar3) {
                                    local_900._20_4_ = 0x2c;
                                    std::make_shared<nigel::Token,nigel::Token::Type>
                                              ((Type *)(local_900 + 0x18));
                                    std::shared_ptr<nigel::Token>::operator=
                                              ((shared_ptr<nigel::Token> *)
                                               &tmp2.
                                                super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount,
                                               (shared_ptr<nigel::Token> *)(local_900 + 0x18));
                                    std::shared_ptr<nigel::Token>::~shared_ptr
                                              ((shared_ptr<nigel::Token> *)(local_900 + 0x18));
                                    p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::
                                              operator->(&local_58)->
                                              super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                    ;
                                    std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::
                                    swap(p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                 *)&tmp2.
                                                  super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          std::__cxx11::string::~string((string *)local_7a8);
        }
        std::__cxx11::string::~string((string *)local_288);
      }
      else {
        p_Var4 = (__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator*(&local_58);
        peVar5 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var4);
        if (peVar5->type == dividingToken) {
          p_Var4 = (__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator*(&local_58);
          std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->(p_Var4);
          Token::as<nigel::Token_DividingToken>((Token *)local_900);
          peVar11 = std::
                    __shared_ptr_access<const_nigel::Token_DividingToken,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<const_nigel::Token_DividingToken,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_900);
          uVar1 = peVar11->token;
          std::shared_ptr<const_nigel::Token_DividingToken>::~shared_ptr
                    ((shared_ptr<const_nigel::Token_DividingToken> *)local_900);
          local_900[0x13] = uVar1;
          if (uVar1 == '$') {
            local_914 = 0x3c;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_910);
            std::shared_ptr<nigel::Token>::operator=
                      ((shared_ptr<nigel::Token> *)
                       &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&local_910);
            std::shared_ptr<nigel::Token>::~shared_ptr(&local_910);
            p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)->
                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                      (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                              &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
          }
          else if (uVar1 == '#') {
            local_92c = 0x3d;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_928);
            std::shared_ptr<nigel::Token>::operator=
                      ((shared_ptr<nigel::Token> *)
                       &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&local_928);
            std::shared_ptr<nigel::Token>::~shared_ptr(&local_928);
            p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)->
                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                      (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                              &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
          }
          else if (uVar1 == '(') {
            local_944 = 0x3e;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_940);
            std::shared_ptr<nigel::Token>::operator=
                      ((shared_ptr<nigel::Token> *)
                       &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&local_940);
            std::shared_ptr<nigel::Token>::~shared_ptr(&local_940);
            p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)->
                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                      (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                              &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
          }
          else if (uVar1 == ')') {
            local_95c = 0x3f;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_958);
            std::shared_ptr<nigel::Token>::operator=
                      ((shared_ptr<nigel::Token> *)
                       &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&local_958);
            std::shared_ptr<nigel::Token>::~shared_ptr(&local_958);
            p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)->
                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                      (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                              &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
          }
          else if (uVar1 == '[') {
            local_974 = 0x40;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_970);
            std::shared_ptr<nigel::Token>::operator=
                      ((shared_ptr<nigel::Token> *)
                       &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&local_970);
            std::shared_ptr<nigel::Token>::~shared_ptr(&local_970);
            p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)->
                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                      (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                              &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
          }
          else if (uVar1 == ']') {
            local_98c = 0x41;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_988);
            std::shared_ptr<nigel::Token>::operator=
                      ((shared_ptr<nigel::Token> *)
                       &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&local_988);
            std::shared_ptr<nigel::Token>::~shared_ptr(&local_988);
            p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)->
                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                      (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                              &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
          }
          else if (uVar1 == '{') {
            local_9a4 = 0x42;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_9a0);
            std::shared_ptr<nigel::Token>::operator=
                      ((shared_ptr<nigel::Token> *)
                       &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&local_9a0);
            std::shared_ptr<nigel::Token>::~shared_ptr(&local_9a0);
            p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)->
                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                      (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                              &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
          }
          else if (uVar1 == '}') {
            local_9bc = 0x43;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_9b8);
            std::shared_ptr<nigel::Token>::operator=
                      ((shared_ptr<nigel::Token> *)
                       &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&local_9b8);
            std::shared_ptr<nigel::Token>::~shared_ptr(&local_9b8);
            p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)->
                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                      (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                              &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
          }
          else if (uVar1 == ',') {
            local_9d4 = 0x44;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_9d0);
            std::shared_ptr<nigel::Token>::operator=
                      ((shared_ptr<nigel::Token> *)
                       &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&local_9d0);
            std::shared_ptr<nigel::Token>::~shared_ptr(&local_9d0);
            p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)->
                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                      (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                              &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
          }
          else if (uVar1 == '.') {
            local_9ec = 0x45;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_9e8);
            std::shared_ptr<nigel::Token>::operator=
                      ((shared_ptr<nigel::Token> *)
                       &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&local_9e8);
            std::shared_ptr<nigel::Token>::~shared_ptr(&local_9e8);
            p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)->
                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                      (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                              &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
          }
          else if (uVar1 == ':') {
            local_a04 = 0x46;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_a00);
            std::shared_ptr<nigel::Token>::operator=
                      ((shared_ptr<nigel::Token> *)
                       &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&local_a00);
            std::shared_ptr<nigel::Token>::~shared_ptr(&local_a00);
            p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)->
                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                      (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                              &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
          }
          else if (uVar1 == ';') {
            local_a1c = 0x47;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_a18);
            std::shared_ptr<nigel::Token>::operator=
                      ((shared_ptr<nigel::Token> *)
                       &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&local_a18);
            std::shared_ptr<nigel::Token>::~shared_ptr(&local_a18);
            p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)->
                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                      (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                              &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
          }
          else if (uVar1 == '?') {
            local_a34 = 0x48;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_a30);
            std::shared_ptr<nigel::Token>::operator=
                      ((shared_ptr<nigel::Token> *)
                       &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&local_a30);
            std::shared_ptr<nigel::Token>::~shared_ptr(&local_a30);
            p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)->
                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                      (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                              &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
          }
          else if (uVar1 == '@') {
            local_a4c = 0x49;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_a48);
            std::shared_ptr<nigel::Token>::operator=
                      ((shared_ptr<nigel::Token> *)
                       &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&local_a48);
            std::shared_ptr<nigel::Token>::~shared_ptr(&local_a48);
            p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)->
                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                      (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                              &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
          }
          else if (uVar1 == '\\') {
            local_a64 = 0x4a;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_a60);
            std::shared_ptr<nigel::Token>::operator=
                      ((shared_ptr<nigel::Token> *)
                       &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&local_a60);
            std::shared_ptr<nigel::Token>::~shared_ptr(&local_a60);
            p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)->
                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                      (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                              &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
          }
          else if (uVar1 == '`') {
            local_a7c = 0x4b;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&local_a78);
            std::shared_ptr<nigel::Token>::operator=
                      ((shared_ptr<nigel::Token> *)
                       &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&local_a78);
            std::shared_ptr<nigel::Token>::~shared_ptr(&local_a78);
            p_Var7 = &std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator->(&local_58)->
                      super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::swap
                      (p_Var7,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)
                              &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
          }
        }
      }
    }
    bVar3 = std::operator!=((shared_ptr<nigel::Token> *)
                            &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,(nullptr_t)0x0);
    if (bVar3) {
      peVar5 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
      sVar2 = peVar5->lineNo;
      p_Var4 = (__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator*(&local_58);
      peVar5 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var4);
      peVar5->lineNo = sVar2;
      peVar5 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
      sVar2 = peVar5->columnNo;
      p_Var4 = (__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator*(&local_58);
      peVar5 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var4);
      peVar5->columnNo = sVar2;
      peVar5 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
      p_Var4 = (__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator*(&local_58);
      peVar12 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var4);
      std::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&peVar12->line,&peVar5->line);
      peVar5 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
      p_Var4 = (__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator*(&local_58);
      peVar12 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var4);
      std::shared_ptr<boost::filesystem::path>::operator=(&peVar12->path,&peVar5->path);
    }
    std::shared_ptr<nigel::Token>::shared_ptr(&local_a90,(nullptr_t)0x0);
    std::shared_ptr<nigel::Token>::operator=
              ((shared_ptr<nigel::Token> *)
               &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_a90);
    std::shared_ptr<nigel::Token>::~shared_ptr(&local_a90);
    p_Var4 = (__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator*(&local_58);
    peVar5 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var4);
    if (peVar5->type == empty) {
      std::__cxx11::
      list<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
      ::push_back((list<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
                   *)&token,&local_58);
    }
    std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator++(&local_58,0);
  }
  __end1 = std::__cxx11::
           list<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
           ::begin((list<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
                    *)&token);
  remove = (_List_iterator<std::shared_ptr<nigel::Token>_> *)
           std::__cxx11::
           list<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
           ::end((list<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
                  *)&token);
  while (bVar3 = std::operator!=(&__end1,(_Self *)&remove), bVar3) {
    local_ab8 = std::_List_iterator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>::operator*
                          (&__end1);
    std::_List_const_iterator<std::shared_ptr<nigel::Token>_>::_List_const_iterator
              (&local_ac0,local_ab8);
    std::__cxx11::
    list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>::erase
              (&base->lexerStruct,local_ac0);
    std::_List_iterator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>::operator++(&__end1);
  }
  std::__cxx11::
  list<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
  ::~list((list<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
           *)&token);
  std::shared_ptr<nigel::Token>::~shared_ptr
            ((shared_ptr<nigel::Token> *)
             &toRemove.
              super__List_base<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
              ._M_impl._M_node._M_size);
  std::shared_ptr<nigel::Token>::~shared_ptr
            ((shared_ptr<nigel::Token> *)
             &tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return success;
}

Assistant:

ExecutionResult Lexer::postLexer( CodeBase &base )
	{
		std::shared_ptr<Token> tmp, tmp2;
		std::list<std::list<std::shared_ptr<Token>>::iterator> toRemove;

		for( auto token = base.lexerStruct.begin() ; token != base.lexerStruct.end() ; token++ )
		{
			if( ( *token )->type == Token::Type::identifier )
			{//Specify some tokens in more detail
				String identifier = ( *token )->as<Token_Identifier>()->identifier;

				if( identifier == "_EOF_" )
				{
					tmp = std::make_shared<Token>( Token::Type::eof );
					token->swap( tmp );
				}
				else if( identifier == "fn" )
				{
					tmp = std::make_shared<Token>( Token::Type::function );
					token->swap( tmp );
				}
				else if( identifier == "byte" )
				{
					tmp = std::make_shared<Token>( Token::Type::type_byte );
					token->swap( tmp );
				}
				else if( identifier == "int" )
				{
					tmp = std::make_shared<Token>( Token::Type::type_int );
					token->swap( tmp );
				}
				else if( identifier == "unsigned" )
				{
					tmp = std::make_shared<Token>( Token::Type::unsigned_attr );
					token->swap( tmp );
				}
				else if( identifier == "fast" )
				{
					tmp = std::make_shared<Token>( Token::Type::fast_attr );
					token->swap( tmp );
				}
				else if( identifier == "norm" )
				{
					tmp = std::make_shared<Token>( Token::Type::norm_attr );
					token->swap( tmp );
				}
				else if( identifier == "ptr" )
				{
					tmp = std::make_shared<Token>( Token::Type::type_ptr );
					token->swap( tmp );
				}
				else if( identifier == "if" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_if );
					token->swap( tmp );
				}
				else if( identifier == "else" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_else );
					token->swap( tmp );
				}
				else if( identifier == "while" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_while );
					token->swap( tmp );
				}
				else if( identifier == "for" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_for );
					token->swap( tmp );
				}
				else if( identifier == "do" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_do );
					token->swap( tmp );
				}
				else if( identifier == "break" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_break );
					token->swap( tmp );
				}
				else if( identifier == "return" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_return );
					token->swap( tmp );
				}
				else if( identifier == "new" )
				{
					tmp = std::make_shared<Token>( Token::Type::dy_new );
					token->swap( tmp );
				}
				else if( identifier == "delete" )
				{
					tmp = std::make_shared<Token>( Token::Type::dy_delete );
					token->swap( tmp );
				}
				else if( identifier == "true" )
				{
					tmp = std::make_shared<Token>( Token::Type::literalTrue );
					token->swap( tmp );
				}
				else if( identifier == "false" )
				{
					tmp = std::make_shared<Token>( Token::Type::literalFalse );
					token->swap( tmp );
				}
			}
			else if( ( *token )->type == Token::Type::operatorToken )
			{
				String identifier = ( *token )->as<Token_Operator>()->operatorToken;

				if( identifier.size() > 1 )
				{//May have to be splitted
					if( identifier.substr( 0, 3 ) == "<<=" || identifier.substr( 0, 3 ) == ">>=" )
					{
						if( identifier.size() > 3 )
						{//Split
							splitToken( identifier, 3, token, base.lexerStruct );
						}
					}
					else if( identifier.substr( 0, 2 ) == "&&" || identifier.substr( 0, 2 ) == "||" || identifier.substr( 0, 2 ) == "<<" || identifier.substr( 0, 2 ) == ">>" || identifier.substr( 0, 2 ) == ">=" || identifier.substr( 0, 2 ) == "<=" || identifier.substr( 0, 2 ) == "++" || identifier.substr( 0, 2 ) == "--" || identifier.substr( 0, 2 ) == "==" || identifier.substr( 0, 2 ) == "!=" || identifier.substr( 0, 2 ) == "+=" || identifier.substr( 0, 2 ) == "-=" || identifier.substr( 0, 2 ) == "*=" || identifier.substr( 0, 2 ) == "/=" || identifier.substr( 0, 2 ) == "%=" || identifier.substr( 0, 2 ) == "&=" || identifier.substr( 0, 2 ) == "|=" || identifier.substr( 0, 2 ) == "^=" )
					{
						if( identifier.size() > 2 )
						{//Split
							splitToken( identifier, 2, token, base.lexerStruct );
						}
					}

					if( identifier == "+=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_add_set );
						token->swap( tmp );
					}
					else if( identifier == "-=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_sub_set );
						token->swap( tmp );
					}
					else if( identifier == "*=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_mul_set );
						token->swap( tmp );
					}
					else if( identifier == "/=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_div_set );
						token->swap( tmp );
					}
					else if( identifier == "%=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_mod_set );
						token->swap( tmp );
					}
					else if( identifier == "==" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_eql );
						token->swap( tmp );
					}
					else if( identifier == "!=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_not_eql );
						token->swap( tmp );
					}
					else if( identifier == "<=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_less_eql );
						token->swap( tmp );
					}
					else if( identifier == ">=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_more_eql );
						token->swap( tmp );
					}
					else if( identifier == "&=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_and_set );
						token->swap( tmp );
					}
					else if( identifier == "|=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_or_set );
						token->swap( tmp );
					}
					else if( identifier == "^=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_xor_set );
						token->swap( tmp );
					}
					else if( identifier == "&&" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_and_log );
						token->swap( tmp );
					}
					else if( identifier == "||" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_or_log );
						token->swap( tmp );
					}
					else if( identifier == "<<" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_shift_left );
						token->swap( tmp );
					}
					else if( identifier == ">>" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_shift_right );
						token->swap( tmp );
					}
					else if( identifier == "<<=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_shift_left_set );
						token->swap( tmp );
					}
					else if( identifier == ">>=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_shift_right_set );
						token->swap( tmp );
					}
					else if( identifier == "++" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_inc );
						token->swap( tmp );
					}
					else if( identifier == "--" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_dec );
						token->swap( tmp );
					}
					else
					{//Split
						splitToken( identifier, 1, token, base.lexerStruct );
					}
				}
				if( identifier.size() == 1 )
				{//Single char operators
					String identifier = ( *token )->as<Token_Operator>()->operatorToken;

					if( identifier == "+" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_add );
						token->swap( tmp );
					}
					else if( identifier == "-" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_sub );
						token->swap( tmp );
					}
					else if( identifier == "*" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_mul );
						token->swap( tmp );
					}
					else if( identifier == "/" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_div );
						token->swap( tmp );
					}
					else if( identifier == "%" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_mod );
						token->swap( tmp );
					}
					else if( identifier == "=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_set );
						token->swap( tmp );
					}
					else if( identifier == "<" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_less );
						token->swap( tmp );
					}
					else if( identifier == ">" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_more );
						token->swap( tmp );
					}
					else if( identifier == "!" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_not );
						token->swap( tmp );
					}
					else if( identifier == "&" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_and );
						token->swap( tmp );
					}
					else if( identifier == "|" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_or );
						token->swap( tmp );
					}
					else if( identifier == "^" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_xor );
						token->swap( tmp );
					}
					else if( identifier == "~" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_inv );
						token->swap( tmp );
					}
				}
			}
			else if( ( *token )->type == Token::Type::dividingToken )
			{
				u8 t = ( *token )->as<Token_DividingToken>()->token;

				if( t == '$' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_dollar );
					token->swap( tmp );
				}
				else if( t == '#' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_hash );
					token->swap( tmp );
				}
				else if( t == '(' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_parenthesis_open );
					token->swap( tmp );
				}
				else if( t == ')' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_parenthesis_close );
					token->swap( tmp );
				}
				else if( t == '[' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_bracket_open );
					token->swap( tmp );
				}
				else if( t == ']' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_bracket_close );
					token->swap( tmp );
				}
				else if( t == '{' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_brace_open );
					token->swap( tmp );
				}
				else if( t == '}' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_brace_close );
					token->swap( tmp );
				}
				else if( t == ',' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_comma );
					token->swap( tmp );
				}
				else if( t == '.' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_period );
					token->swap( tmp );
				}
				else if( t == ':' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_colon );
					token->swap( tmp );
				}
				else if( t == ';' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_semicolon );
					token->swap( tmp );
				}
				else if( t == '?' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_questionmark );
					token->swap( tmp );
				}
				else if( t == '@' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_at );
					token->swap( tmp );
				}
				else if( t == '\\' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_backslash );
					token->swap( tmp );
				}
				else if( t == '`' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_grave );
					token->swap( tmp );
				}
			}
			if( tmp != nullptr )
			{//Move also metadata. Use inverted order because of swap
				( *token )->lineNo = tmp->lineNo;
				( *token )->columnNo = tmp->columnNo;
				( *token )->line = tmp->line;
				( *token )->path = tmp->path;
			}
			tmp = nullptr;

			if( ( *token )->type == Token::Type::empty )
			{
				toRemove.push_back( token );
			}
		}

		//Remove empty token, if any
		for( auto &remove : toRemove )
		{
			base.lexerStruct.erase( remove );
		}

		return ExecutionResult::success;
	}